

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O3

int __thiscall jrtplib::RTPPacketBuilder::DeleteCSRC(RTPPacketBuilder *this,uint32_t csrc)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = -0x14;
  if (this->init == true) {
    iVar2 = this->numcsrcs;
    iVar4 = -0xf;
    if (0 < iVar2) {
      uVar5 = 0;
      do {
        uVar3 = this->csrcs[uVar5];
        uVar5 = (uVar3 != csrc) + uVar5;
        if (uVar3 == csrc) break;
      } while ((int)uVar5 < iVar2);
      if (uVar3 == csrc) {
        uVar1 = iVar2 - 1;
        this->numcsrcs = uVar1;
        iVar4 = 0;
        if ((iVar2 != 1) && (uVar1 != uVar5)) {
          this->csrcs[uVar5] = this->csrcs[uVar1];
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int RTPPacketBuilder::DeleteCSRC(uint32_t csrc)
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	
	int i = 0;
	bool found = false;

	while (!found && i < numcsrcs)
	{
		if (csrcs[i] == csrc)
			found = true;
		else
			i++;
	}

	if (!found)
		return ERR_RTP_PACKBUILD_CSRCNOTINLIST;
	
	// move the last csrc in the place of the deleted one
	numcsrcs--;
	if (numcsrcs > 0 && numcsrcs != i)
		csrcs[i] = csrcs[numcsrcs];
	return 0;
}